

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O2

CURLcode cf_hc_connect(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  CURLcode *pCVar1;
  void *pvVar2;
  curl_trc_feat *pcVar3;
  CURLcode CVar4;
  int iVar5;
  timediff_t tVar6;
  undefined8 uVar7;
  cf_hc_baller *b;
  CURLcode *pCVar8;
  CURLcode CVar9;
  undefined8 uVar10;
  long lVar11;
  bool bVar13;
  curltime cVar14;
  curltime newer;
  undefined8 uVar12;
  
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  pCVar1 = (CURLcode *)cf->ctx;
  *done = false;
  cVar14 = Curl_now();
  CVar9 = CURLE_OK;
  switch(*pCVar1) {
  case CURLE_OK:
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))))
       && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"connect, init");
    }
    *(time_t *)(pCVar1 + 4) = cVar14.tv_sec;
    pCVar1[6] = cVar14.tv_usec;
    cf_hc_baller_init((cf_hc_baller *)(pCVar1 + 10),cf,data,(uint)cf->conn->transport);
    if (((((CURLE_UNSUPPORTED_PROTOCOL < (ulong)*(undefined8 *)(pCVar1 + 0x26)) &&
          (Curl_expire(data,(ulong)pCVar1[0x28],EXPIRE_ALPN_EYEBALLS), data != (Curl_easy *)0x0)) &&
         (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))))
       && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"set next attempt to start in %ums");
    }
    *pCVar1 = CURLE_UNSUPPORTED_PROTOCOL;
  case CURLE_UNSUPPORTED_PROTOCOL:
    CVar4 = CURLE_OK;
    if ((*(undefined8 *)(pCVar1 + 0xc) == CURLE_OK) || (CVar4 = CURLE_OK, pCVar1[0xe] != CURLE_OK))
    {
LAB_00114851:
      pvVar2 = cf->ctx;
      if ((*(ulong *)((long)pvVar2 + 0x98) < 2) || (*(long *)((long)pvVar2 + 0x68) != 0))
      goto LAB_001149fe;
      if (*(int *)((long)pvVar2 + 0x38) == 0) {
        newer._12_4_ = 0;
        newer.tv_sec = SUB128(cVar14._0_12_,0);
        newer.tv_usec = SUB124(cVar14._0_12_,8);
        cVar14._12_4_ = 0;
        cVar14._0_12_ = *(undefined1 (*) [12])((long)pvVar2 + 0x10);
        tVar6 = Curl_timediff(newer,cVar14);
        if ((long)(ulong)*(uint *)((long)pvVar2 + 0xa4) <= tVar6) {
          if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
              ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 ||
               (0 < pcVar3->log_level)))) && (0 < cf->cft->log_level)) {
            Curl_trc_cf_infof(data,cf,"hard timeout of %dms reached, starting %s",
                              (ulong)*(uint *)((long)pvVar2 + 0xa4),
                              *(undefined8 *)((long)pvVar2 + 0x60));
          }
          goto LAB_001149e0;
        }
        if ((long)(ulong)*(uint *)((long)pvVar2 + 0xa0) <= tVar6) {
          iVar5 = cf_hc_baller_reply_ms((cf_hc_baller *)((long)pvVar2 + 0x28),data);
          if (iVar5 < 0) {
            if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
                ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 ||
                 (0 < pcVar3->log_level)))) && (0 < cf->cft->log_level)) {
              Curl_trc_cf_infof(data,cf,
                                "soft timeout of %dms reached, %s has not seen any data, starting %s"
                                ,(ulong)*(uint *)((long)pvVar2 + 0xa0),
                                *(undefined8 *)((long)pvVar2 + 0x28),
                                *(undefined8 *)((long)pvVar2 + 0x60));
            }
            goto LAB_001149e0;
          }
          Curl_expire(data,(ulong)*(uint *)((long)pvVar2 + 0xa4) - tVar6,EXPIRE_ALPN_EYEBALLS);
        }
      }
      else {
        if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
            ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)
             ))) && (0 < cf->cft->log_level)) {
          Curl_trc_cf_infof(data,cf,"all previous attempts failed, starting %s",
                            *(undefined8 *)((long)pvVar2 + 0x60));
        }
LAB_001149e0:
        cf_hc_baller_init((cf_hc_baller *)(pCVar1 + 0x18),cf,data,(uint)cf->conn->transport);
      }
LAB_001149fe:
      if (((CURLE_UNSUPPORTED_PROTOCOL < (ulong)*(undefined8 *)(pCVar1 + 0x26)) &&
          (*(undefined8 *)(pCVar1 + 0x1a) != CURLE_OK)) && (pCVar1[0x1c] == CURLE_OK)) {
        b = (cf_hc_baller *)(pCVar1 + 0x18);
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
           (((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)
             ) && (0 < cf->cft->log_level)))) {
          Curl_trc_cf_infof(data,cf,"connect, check %s",b->name);
        }
        CVar4 = cf_hc_baller_connect(b,cf,data,done);
        if ((CVar4 == CURLE_OK) && (CVar4 = CURLE_OK, *done == true)) goto LAB_00114a8a;
      }
      uVar12 = *(undefined8 *)(pCVar1 + 0x26);
      uVar7 = CURLE_OK;
      uVar10 = uVar12;
      pCVar8 = pCVar1;
      while( true ) {
        pCVar8 = pCVar8 + 0xe;
        bVar13 = uVar10 == CURLE_OK;
        uVar10 = uVar10 - CURLE_UNSUPPORTED_PROTOCOL;
        if (bVar13) break;
        uVar7 = (uVar7 + CURLE_UNSUPPORTED_PROTOCOL) - (ulong)(*pCVar8 == CURLE_OK);
      }
      if (uVar7 == uVar12) {
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) {
          pcVar3 = (data->state).feat;
          if (pcVar3 == (curl_trc_feat *)0x0) {
            if (cf != (Curl_cfilter *)0x0) goto LAB_00114af0;
          }
          else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar3->log_level)) {
LAB_00114af0:
            if (0 < cf->cft->log_level) {
              Curl_trc_cf_infof(data,cf,"connect, all attempts failed");
              uVar12 = *(undefined8 *)(pCVar1 + 0x26);
            }
          }
        }
        lVar11 = uVar12 + CURLE_UNSUPPORTED_PROTOCOL;
        pCVar8 = pCVar1;
        do {
          pCVar8 = pCVar8 + 0xe;
          lVar11 = lVar11 + -1;
          CVar9 = CVar4;
          if (lVar11 == 0) break;
          CVar9 = *pCVar8;
        } while (CVar9 == CURLE_OK);
        *pCVar1 = CURLE_URL_MALFORMAT;
        break;
      }
      *done = false;
    }
    else {
      b = (cf_hc_baller *)(pCVar1 + 10);
      CVar4 = cf_hc_baller_connect(b,cf,data,done);
      if ((CVar4 != CURLE_OK) || (CVar4 = CURLE_OK, *done != true)) goto LAB_00114851;
LAB_00114a8a:
      baller_connected(cf,data,b);
    }
    CVar9 = CURLE_OK;
    break;
  case CURLE_FAILED_INIT:
    cf->field_0x24 = cf->field_0x24 | 1;
    *done = true;
    CVar9 = CURLE_OK;
    break;
  case CURLE_URL_MALFORMAT:
    CVar9 = pCVar1[8];
    cf->field_0x24 = cf->field_0x24 & 0xfe;
    *done = false;
  }
  if ((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) {
    pcVar3 = (data->state).feat;
    if (pcVar3 == (curl_trc_feat *)0x0) {
      if (cf == (Curl_cfilter *)0x0) {
        return CVar9;
      }
    }
    else {
      if (cf == (Curl_cfilter *)0x0) {
        return CVar9;
      }
      if (pcVar3->log_level < 1) {
        return CVar9;
      }
    }
    if (0 < cf->cft->log_level) {
      Curl_trc_cf_infof(data,cf,"connect -> %d, done=%d",(ulong)CVar9,(ulong)*done);
    }
  }
  return CVar9;
}

Assistant:

static CURLcode cf_hc_connect(struct Curl_cfilter *cf,
                              struct Curl_easy *data,
                              bool *done)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  struct curltime now;
  CURLcode result = CURLE_OK;
  size_t i, failed_ballers;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  *done = FALSE;
  now = Curl_now();
  switch(ctx->state) {
  case CF_HC_INIT:
    DEBUGASSERT(!cf->next);
    for(i = 0; i < ctx->baller_count; i++)
      DEBUGASSERT(!ctx->ballers[i].cf);
    CURL_TRC_CF(data, cf, "connect, init");
    ctx->started = now;
    cf_hc_baller_init(&ctx->ballers[0], cf, data, cf->conn->transport);
    if(ctx->baller_count > 1) {
      Curl_expire(data, ctx->soft_eyeballs_timeout_ms, EXPIRE_ALPN_EYEBALLS);
      CURL_TRC_CF(data, cf, "set next attempt to start in %ums",
                  ctx->soft_eyeballs_timeout_ms);
    }
    ctx->state = CF_HC_CONNECT;
    FALLTHROUGH();

  case CF_HC_CONNECT:
    if(cf_hc_baller_is_active(&ctx->ballers[0])) {
      result = cf_hc_baller_connect(&ctx->ballers[0], cf, data, done);
      if(!result && *done) {
        result = baller_connected(cf, data, &ctx->ballers[0]);
        goto out;
      }
    }

    if(time_to_start_next(cf, data, 1, now)) {
      cf_hc_baller_init(&ctx->ballers[1], cf, data, cf->conn->transport);
    }

    if((ctx->baller_count > 1) && cf_hc_baller_is_active(&ctx->ballers[1])) {
      CURL_TRC_CF(data, cf, "connect, check %s", ctx->ballers[1].name);
      result = cf_hc_baller_connect(&ctx->ballers[1], cf, data, done);
      if(!result && *done) {
        result = baller_connected(cf, data, &ctx->ballers[1]);
        goto out;
      }
    }

    failed_ballers = 0;
    for(i = 0; i < ctx->baller_count; i++) {
      if(ctx->ballers[i].result)
        ++failed_ballers;
    }

    if(failed_ballers == ctx->baller_count) {
      /* all have failed. we give up */
      CURL_TRC_CF(data, cf, "connect, all attempts failed");
      for(i = 0; i < ctx->baller_count; i++) {
        if(ctx->ballers[i].result) {
          result = ctx->ballers[i].result;
          break;
        }
      }
      ctx->state = CF_HC_FAILURE;
      goto out;
    }
    result = CURLE_OK;
    *done = FALSE;
    break;

  case CF_HC_FAILURE:
    result = ctx->result;
    cf->connected = FALSE;
    *done = FALSE;
    break;

  case CF_HC_SUCCESS:
    result = CURLE_OK;
    cf->connected = TRUE;
    *done = TRUE;
    break;
  }

out:
  CURL_TRC_CF(data, cf, "connect -> %d, done=%d", result, *done);
  return result;
}